

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backup.c
# Opt level: O0

void * encrypt_thread(void *pargs)

{
  __uint32_t local_8260 [2];
  anon_union_16_2_61e66bc1 footer;
  ssize_t rd;
  uint8_t buffer [32816];
  uint8_t iv [16];
  aes_context aes;
  sha256_context tmp;
  sha256_context ctx;
  args_t *args;
  void *pargs_local;
  
  buffer._32808_8_ = *(undefined8 *)((long)pargs + 0x28);
  iv._0_8_ = *(undefined8 *)((long)pargs + 0x30);
  aes_init((aes_context *)(iv + 8),(uint8_t *)((long)pargs + 8),0x100);
  aes_ecb_encrypt((aes_context *)(iv + 8),buffer + 0x8028,buffer + 0x8028);
  write_block(*(int *)((long)pargs + 4),buffer + 0x8028,0x10);
  sha256_init((sha256_context *)(tmp.buffer + 0x38));
  sha256_starts((sha256_context *)(tmp.buffer + 0x38));
  footer._0_8_ = 0x10;
  local_8260[0] = 0;
  local_8260[1] = 0;
  do {
    footer.data.total = read_block(*pargs,&rd,0x8000);
    if ((long)footer.data.total < 1) {
      if ((long)footer.data.total < 0) {
        fprintf(_stderr,"Read error occured!\n");
      }
      else {
        footer._0_8_ = footer._0_8_ + 0x10;
        local_8260[0] = __uint32_identity(local_8260[0]);
        footer._0_8_ = __uint64_identity(footer._0_8_);
        aes_cbc_encrypt((aes_context *)(iv + 8),buffer + 0x8028,(uint8_t *)local_8260,0x10,
                        (uint8_t *)local_8260);
        write_block(*(int *)((long)pargs + 4),local_8260,0x10);
      }
LAB_00102ed9:
      close(*(int *)((long)pargs + 4));
      close(*pargs);
      return (void *)0x0;
    }
    sha256_update((sha256_context *)(tmp.buffer + 0x38),(uchar *)&rd,footer.data.total);
    sha256_copy((sha256_context *)(aes.key + 0x42),(sha256_context *)(tmp.buffer + 0x38));
    sha256_final((sha256_context *)(aes.key + 0x42),buffer + (footer.data.total - 8));
    footer.data.total = footer.data.total + 0x20;
    if (local_8260[0] != 0) {
      fprintf(_stderr,"an internal error has occured!\n");
      goto LAB_00102ed9;
    }
    if ((footer.data.total & 0xf) != 0) {
      local_8260[0] = 0x10 - ((uint)footer.data.total & 0xf);
      footer.data.total = local_8260[0] + footer.data.total;
    }
    aes_cbc_encrypt((aes_context *)(iv + 8),buffer + 0x8028,(uint8_t *)&rd,footer.data.total,
                    (uint8_t *)&rd);
    buffer._32808_8_ = *(undefined8 *)((long)&footer + footer.data.total);
    iv._0_8_ = *(undefined8 *)((long)&footer + footer.data.total + 8);
    write_block(*(int *)((long)pargs + 4),&rd,footer.data.total);
    footer._0_8_ = footer.data.total + footer._0_8_;
  } while( true );
}

Assistant:

void *encrypt_thread(void *pargs) {
  args_t *args = (args_t *)pargs;
  sha256_context ctx, tmp;
  aes_context aes;
  uint8_t iv[AES_BLOCK_SIZE];
  uint8_t buffer[PSVIMG_BLOCK_SIZE + SHA256_BLOCK_SIZE + 0x10];
  ssize_t rd;
  union {
    struct {
      uint32_t padding;
      uint32_t unused;
      uint64_t total;
    } __attribute__((packed)) data;
    uint8_t raw[AES_BLOCK_SIZE];
  } footer;

  // write iv
  memcpy(iv, args->iv, AES_BLOCK_SIZE);
  aes_init(&aes, args->key, 256);
  aes_ecb_encrypt(&aes, iv, iv);
  write_block(args->out, iv, AES_BLOCK_SIZE);

  // encrypt blocks
  sha256_init(&ctx);
  sha256_starts(&ctx);
  footer.data.total = AES_BLOCK_SIZE; // from iv
  footer.data.padding = 0;
  footer.data.unused = 0;
  while ((rd = read_block(args->in, buffer, PSVIMG_BLOCK_SIZE)) > 0) {
    // generate hash
    sha256_update(&ctx, buffer, rd);
    sha256_copy(&tmp, &ctx);
    sha256_final(&tmp, &buffer[rd]);
    rd += SHA256_BLOCK_SIZE;

    // add padding
    if (footer.data.padding != 0) { // we should be reading 0x8000 blocks! only need padding once
      fprintf(stderr, "an internal error has occured!\n");
      goto end;
    }
    if (rd & (AES_BLOCK_SIZE-1)) {
      footer.data.padding = AES_BLOCK_SIZE - (rd & (AES_BLOCK_SIZE-1));
      rd += footer.data.padding;
    }

    // encrypt
    aes_cbc_encrypt(&aes, iv, buffer, rd, buffer);

    // save next iv
    memcpy(iv, &buffer[rd - AES_BLOCK_SIZE], AES_BLOCK_SIZE);

    // write output
    write_block(args->out, buffer, rd);

    footer.data.total += rd;
  }

  if (rd < 0) {
    fprintf(stderr, "Read error occured!\n");
    goto end;
  }

  // send footer
  footer.data.total += 0x10;
  footer.data.padding = htole32(footer.data.padding);
  footer.data.total = htole64(footer.data.total);
  aes_cbc_encrypt(&aes, iv, footer.raw, AES_BLOCK_SIZE, footer.raw);
  write_block(args->out, footer.raw, AES_BLOCK_SIZE);

end:
  close(args->out);
  close(args->in);
  return NULL;
}